

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

void __thiscall
ON_Layer::GetPerViewportVisibilityViewportIds
          (ON_Layer *this,ON_SimpleArray<ON_UUID_struct> *viewport_id_list)

{
  uint uVar1;
  ON__LayerExtensions *pOVar2;
  long lVar3;
  size_t newcap;
  ON__LayerPerViewSettings *this_00;
  
  if (-1 < viewport_id_list->m_capacity) {
    viewport_id_list->m_count = 0;
  }
  pOVar2 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
  if ((pOVar2 != (ON__LayerExtensions *)0x0) &&
     (newcap = (size_t)(pOVar2->m_vp_settings).m_count, 0 < (long)newcap)) {
    ON_SimpleArray<ON_UUID_struct>::Reserve(viewport_id_list,newcap);
    for (lVar3 = 0; newcap * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
      this_00 = (ON__LayerPerViewSettings *)
                ((((pOVar2->m_vp_settings).m_a)->m_viewport_id).Data4 + lVar3 + -8);
      uVar1 = ON__LayerPerViewSettings::SettingsMask(this_00);
      if ((uVar1 & 0x10) == 0) {
        uVar1 = ON__LayerPerViewSettings::SettingsMask(this_00);
        if (0x1f < uVar1) goto LAB_004dca70;
      }
      else {
LAB_004dca70:
        ON_SimpleArray<ON_UUID_struct>::Append(viewport_id_list,(ON_UUID_struct *)this_00);
      }
    }
  }
  return;
}

Assistant:

void ON_Layer::GetPerViewportVisibilityViewportIds(
    ON_SimpleArray<ON_UUID>& viewport_id_list
    ) const
{
  viewport_id_list.SetCount(0);
  const ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
  if ( 0 != ud )
  {
    const int count = ud->m_vp_settings.Count();
    if ( count > 0 )
    {
      viewport_id_list.Reserve(count);
      for( int i = 0; i < count; i++ )
      {
        const ON__LayerPerViewSettings& s = ud->m_vp_settings[i];
        if (    0 != ( ON_Layer::per_viewport_visible & s.SettingsMask() ) 
             || 0 != ( ON_Layer::per_viewport_persistent_visibility & s.SettingsMask() ) 
           )
        {
          viewport_id_list.Append(s.m_viewport_id);
        }
      }
    }
  }
}